

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

AInventory * P_DropItem(AActor *source,PClassActor *type,int dropamount,int chance)

{
  byte *pbVar1;
  PClass *pPVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  AInventory *inv_00;
  undefined4 extraout_var;
  PClass *pPVar6;
  AInventory *inv;
  bool bVar7;
  DVector3 local_40;
  
  if ((type != (PClassActor *)0x0) &&
     (uVar4 = FRandom::GenRand32(&pr_dropitem), (int)(uVar4 & 0xff) <= chance)) {
    local_40.Z = 0.0;
    if (((byte)i_compatflags & 0x80) == 0) {
      iVar5 = sv_dropstyle.Value;
      if (sv_dropstyle.Value == 0) {
        iVar5 = gameinfo.defaultdropstyle;
      }
      if (iVar5 == 2) {
        local_40.Z = 24.0;
      }
      else {
        local_40.Z = source->Height * 0.5;
      }
    }
    local_40.Z = local_40.Z + (source->__Pos).Z;
    local_40.X = (source->__Pos).X;
    local_40.Y = (source->__Pos).Y;
    inv_00 = (AInventory *)AActor::StaticSpawn(type,&local_40,ALLOW_REPLACE,false);
    bVar3 = true;
    if (inv_00 != (AInventory *)0x0) {
      (inv_00->super_AActor).flags.Value = (inv_00->super_AActor).flags.Value & 0xfffdfdff | 0x20000
      ;
      if (((byte)i_compatflags & 0x80) == 0) {
        P_TossItem((AActor *)inv_00);
      }
      pPVar2 = AInventory::RegistrationInfo.MyClass;
      if ((inv_00->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(inv_00->super_AActor).super_DThinker.super_DObject._vptr_DObject)(inv_00);
        (inv_00->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar6 = (inv_00->super_AActor).super_DThinker.super_DObject.Class;
      bVar7 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar2 && bVar7) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar7 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar2) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      type = (PClassActor *)inv_00;
      if (bVar7) {
        ModifyDropAmount(inv_00,dropamount);
        pbVar1 = (byte *)((long)&inv_00->ItemFlags + 2);
        *pbVar1 = *pbVar1 | 0x40;
        bVar3 = AInventory::CallSpecialDropAction(inv_00,source);
        if (bVar3) {
          (*(inv_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(inv_00);
          inv_00 = (AInventory *)0x0;
        }
        bVar3 = false;
        type = (PClassActor *)inv_00;
      }
    }
    if (!bVar3) {
      return (AInventory *)type;
    }
  }
  return (AInventory *)0x0;
}

Assistant:

AInventory *P_DropItem (AActor *source, PClassActor *type, int dropamount, int chance)
{
	if (type != NULL && pr_dropitem() <= chance)
	{
		AActor *mo;
		double spawnz = 0;

		if (!(i_compatflags & COMPATF_NOTOSSDROPS))
		{
			int style = sv_dropstyle;
			if (style == 0)
			{
				style = gameinfo.defaultdropstyle;
			}
			if (style == 2)
			{
				spawnz = 24;
			}
			else
			{
				spawnz = source->Height / 2;
			}
		}
		mo = Spawn(type, source->PosPlusZ(spawnz), ALLOW_REPLACE);
		if (mo != NULL)
		{
			mo->flags |= MF_DROPPED;
			mo->flags &= ~MF_NOGRAVITY;	// [RH] Make sure it is affected by gravity
			if (!(i_compatflags & COMPATF_NOTOSSDROPS))
			{
				P_TossItem (mo);
			}
			if (mo->IsKindOf (RUNTIME_CLASS(AInventory)))
			{
				AInventory *inv = static_cast<AInventory *>(mo);
				ModifyDropAmount(inv, dropamount);
				inv->ItemFlags |= IF_TOSSED;
				if (inv->CallSpecialDropAction (source))
				{
					// The special action indicates that the item should not spawn
					inv->Destroy();
					return NULL;
				}
				return inv;
			}
			// we can't really return an AInventory pointer to a non-inventory item here, can we?
		}
	}
	return NULL;
}